

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatClause.c
# Opt level: O0

void Msat_ClauseWriteDimacs(FILE *pFile,Msat_Clause_t *pC,int fIncrement)

{
  char *pcVar1;
  int local_20;
  int i;
  int fIncrement_local;
  Msat_Clause_t *pC_local;
  FILE *pFile_local;
  
  for (local_20 = 0; local_20 < (int)(*(uint *)&pC->field_0x4 >> 3 & 0x3fff);
      local_20 = local_20 + 1) {
    pcVar1 = "";
    if (((&pC[1].Num)[local_20] & 1U) != 0) {
      pcVar1 = "-";
    }
    fprintf((FILE *)pFile,"%s%d ",pcVar1,
            (ulong)((&pC[1].Num)[local_20] / 2 + (uint)(0 < fIncrement)));
  }
  if (fIncrement != 0) {
    fprintf((FILE *)pFile,"0");
  }
  fprintf((FILE *)pFile,"\n");
  return;
}

Assistant:

void Msat_ClauseWriteDimacs( FILE * pFile, Msat_Clause_t * pC, int  fIncrement )
{
    int i;
    for ( i = 0; i < (int)pC->nSize; i++ )
        fprintf( pFile, "%s%d ", ((pC->pData[i]&1)? "-": ""),  pC->pData[i]/2 + (int)(fIncrement>0) );
    if ( fIncrement )
        fprintf( pFile, "0" );
    fprintf( pFile, "\n" );
}